

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_pcm_rb_commit_write(ma_pcm_rb *pRB,ma_uint32 sizeInFrames)

{
  ma_result mVar1;
  
  if (pRB != (ma_pcm_rb *)0x0) {
    mVar1 = ma_rb_commit_write(&pRB->rb,(ulong)(sizeInFrames * pRB->channels *
                                               *(int *)(&DAT_00176420 + (ulong)pRB->format * 4)));
    return mVar1;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_pcm_rb_commit_write(ma_pcm_rb* pRB, ma_uint32 sizeInFrames)
{
    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    return ma_rb_commit_write(&pRB->rb, sizeInFrames * ma_pcm_rb_get_bpf(pRB));
}